

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QList<int> * __thiscall
QDockAreaLayout::indexOfPlaceHolder
          (QList<int> *__return_storage_ptr__,QDockAreaLayout *this,QString *objectName)

{
  long lVar1;
  QDockAreaLayoutInfo *this_00;
  
  this_00 = this->docks;
  lVar1 = 0;
  while( true ) {
    if (lVar1 == 4) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (int *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    QDockAreaLayoutInfo::indexOfPlaceHolder(__return_storage_ptr__,this_00,objectName);
    if ((__return_storage_ptr__->d).size != 0) break;
    QArrayDataPointer<int>::~QArrayDataPointer(&__return_storage_ptr__->d);
    lVar1 = lVar1 + 1;
    this_00 = this_00 + 1;
  }
  QList<int>::prepend(__return_storage_ptr__,(parameter_type)lVar1);
  return __return_storage_ptr__;
}

Assistant:

QList<int> QDockAreaLayout::indexOfPlaceHolder(const QString &objectName) const
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        QList<int> result = docks[i].indexOfPlaceHolder(objectName);
        if (!result.isEmpty()) {
            result.prepend(i);
            return result;
        }
    }
    return QList<int>();
}